

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5HeapArgumentsObject::SetPropertyWithAttributesForFormal
          (ES5HeapArgumentsObject *this,uint32 index,PropertyId propertyId,Var value,
          PropertyAttributes attributes,PropertyValueInfo *info,PropertyOperationFlags flags,
          SideEffects possibleSideEffects)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  BOOL tempResult;
  BOOL result;
  PropertyValueInfo *info_local;
  PropertyAttributes attributes_local;
  Var value_local;
  PropertyId propertyId_local;
  uint32 index_local;
  ES5HeapArgumentsObject *this_local;
  
  BVar3 = HeapArgumentsObject::IsFormalArgument(&this->super_HeapArgumentsObject,propertyId);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArgumentsObject.cpp"
                                ,0x319,"(this->IsFormalArgument(propertyId))",
                                "SetPropertyWithAttributesForFormal: called for non-formal");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  BVar3 = DynamicObject::SetPropertyWithAttributes
                    ((DynamicObject *)this,propertyId,value,attributes,info,flags,
                     possibleSideEffects);
  if (BVar3 != 0) {
    if ((attributes & 4) == 0) {
      DisconnectFormalFromNamedArgument(this,index);
    }
    BVar4 = IsFormalDisconnectedFromNamedArgument(this,index);
    if ((BVar4 == 0) &&
       (iVar5 = (*(this->super_HeapArgumentsObject).super_ArgumentsObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x71])(this,(ulong)index,value), iVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArgumentsObject.cpp"
                                  ,0x328,"(tempResult)","this->SetItem(index, value)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
  }
  return BVar3;
}

Assistant:

BOOL ES5HeapArgumentsObject::SetPropertyWithAttributesForFormal(uint32 index, PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        AssertMsg(this->IsFormalArgument(propertyId), "SetPropertyWithAttributesForFormal: called for non-formal");

        BOOL result = this->DynamicObject::SetPropertyWithAttributes(propertyId, value, attributes, info, flags, possibleSideEffects);
        if (result)
        {
            if ((attributes & PropertyWritable) == 0)
            {
                // Setting writable to false should cause disconnect.
                this->DisconnectFormalFromNamedArgument(index);
            }

            if (!this->IsFormalDisconnectedFromNamedArgument(index))
            {
                // Update the (connected with named param) value, as above call could cause change of the value.
                BOOL tempResult = this->SetItemAt(index, value);  // Update the value in frameObject.
                AssertMsg(tempResult, "this->SetItem(index, value)");
            }
        }

        return result;
    }